

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O0

void __thiscall Assimp::FBXImporter::SetupProperties(FBXImporter *this,Importer *pImp)

{
  bool bVar1;
  Importer *pImp_local;
  FBXImporter *this_local;
  
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_FBX_READ_ALL_GEOMETRY_LAYERS",true);
  (this->settings).readAllLayers = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_FBX_READ_ALL_MATERIALS",false);
  (this->settings).readAllMaterials = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_FBX_READ_MATERIALS",true);
  (this->settings).readMaterials = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_FBX_READ_TEXTURES",true);
  (this->settings).readTextures = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_FBX_READ_CAMERAS",true);
  (this->settings).readCameras = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_FBX_READ_LIGHTS",true);
  (this->settings).readLights = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_FBX_READ_ANIMATIONS",true);
  (this->settings).readAnimations = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_FBX_STRICT_MODE",false);
  (this->settings).strictMode = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_FBX_PRESERVE_PIVOTS",true);
  (this->settings).preservePivots = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_FBX_OPTIMIZE_EMPTY_ANIMATION_CURVES",true);
  (this->settings).optimizeEmptyAnimationCurves = bVar1;
  bVar1 = Importer::GetPropertyBool
                    (pImp,"AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING",false);
  (this->settings).useLegacyEmbeddedTextureNaming = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"AI_CONFIG_IMPORT_REMOVE_EMPTY_BONES",true);
  (this->settings).removeEmptyBones = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"AI_CONFIG_FBX_CONVERT_TO_M",false);
  (this->settings).convertToMeters = bVar1;
  return;
}

Assistant:

void FBXImporter::SetupProperties(const Importer* pImp)
{
    settings.readAllLayers = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_ALL_GEOMETRY_LAYERS, true);
    settings.readAllMaterials = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_ALL_MATERIALS, false);
    settings.readMaterials = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_MATERIALS, true);
    settings.readTextures = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_TEXTURES, true);
    settings.readCameras = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_CAMERAS, true);
    settings.readLights = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_LIGHTS, true);
    settings.readAnimations = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_READ_ANIMATIONS, true);
    settings.strictMode = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_STRICT_MODE, false);
    settings.preservePivots = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_PRESERVE_PIVOTS, true);
    settings.optimizeEmptyAnimationCurves = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_OPTIMIZE_EMPTY_ANIMATION_CURVES, true);
    settings.useLegacyEmbeddedTextureNaming = pImp->GetPropertyBool(AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING, false);
    settings.removeEmptyBones = pImp->GetPropertyBool(AI_CONFIG_IMPORT_REMOVE_EMPTY_BONES, true);
    settings.convertToMeters = pImp->GetPropertyBool(AI_CONFIG_FBX_CONVERT_TO_M, false);
}